

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O2

void __thiscall Database::flush(Database *this,int i)

{
  size_t __n;
  Database *pDVar1;
  char __rhs;
  int __fd;
  int __fd_00;
  int __fd_01;
  int __fd_02;
  int __fd_03;
  int __fd_04;
  void *__dest;
  ulong uVar2;
  size_t __n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  Database *local_38;
  
  __rhs = (char)i + '0';
  std::operator+(&local_80,&A_ORDERDATE_PATH_abi_cxx11_,__rhs);
  __fd = open(local_80._M_dataplus._M_p,0x42,0x1ff);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_80,&A_MINSHIPDATE_PATH_abi_cxx11_,__rhs);
  __fd_00 = open(local_80._M_dataplus._M_p,0x42,0x1ff);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_80,&A_MAXSHIPDATE_PATH_abi_cxx11_,__rhs);
  __fd_01 = open(local_80._M_dataplus._M_p,0x42,0x1ff);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_80,&A_EXTENDEDPRICESUM_PATH_abi_cxx11_,__rhs);
  __fd_02 = open(local_80._M_dataplus._M_p,0x42,0x1ff);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_80,&A_ORDERKEY_PATH_abi_cxx11_,__rhs);
  __fd_03 = open(local_80._M_dataplus._M_p,0x42,0x1ff);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_80,&A_LINEITEMPOSITION_PATH_abi_cxx11_,__rhs);
  __fd_04 = open(local_80._M_dataplus._M_p,0x42,0x1ff);
  std::__cxx11::string::~string((string *)&local_80);
  uVar2 = (ulong)(*this->a_orderkey[i] + 1);
  __n = uVar2 * 2;
  local_38 = this;
  fallocate(__fd,0,0,__n);
  fallocate(__fd_00,0,0,__n);
  fallocate(__fd_01,0,0,__n);
  __n_00 = uVar2 << 2;
  fallocate(__fd_02,0,0,__n_00);
  fallocate(__fd_03,0,0,__n_00);
  fallocate(__fd_04,0,0,__n_00);
  local_40 = mmap((void *)0x0,__n,3,1,__fd,0);
  local_48 = mmap((void *)0x0,__n,3,1,__fd_00,0);
  local_50 = mmap((void *)0x0,__n,3,1,__fd_01,0);
  local_58 = mmap((void *)0x0,__n_00,3,1,__fd_02,0);
  local_60 = mmap((void *)0x0,__n_00,3,1,__fd_03,0);
  __dest = mmap((void *)0x0,__n_00,3,1,__fd_04,0);
  pDVar1 = local_38;
  memcpy(local_40,local_38->a_orderdate[i],__n);
  memcpy(local_48,pDVar1->a_minshipdate[i],__n);
  memcpy(local_50,pDVar1->a_maxshipdate[i],__n);
  memcpy(local_58,pDVar1->a_extendedpricesum[i],__n_00);
  memcpy(local_60,pDVar1->a_orderkey[i],__n_00);
  memcpy(__dest,pDVar1->a_lineitemposition[i],__n_00);
  close(__fd);
  close(__fd_00);
  close(__fd_01);
  close(__fd_02);
  close(__fd_03);
  close(__fd_04);
  LOCK();
  (pDVar1->pending).super___atomic_base<unsigned_char>._M_i =
       (pDVar1->pending).super___atomic_base<unsigned_char>._M_i + 0xff;
  UNLOCK();
  return;
}

Assistant:

void Database::flush(int i) {

  auto a_orderdate_fd = open((A_ORDERDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_minshipdate_fd = open((A_MINSHIPDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_maxshipdate_fd = open((A_MAXSHIPDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_extendedpricesum_fd = open((A_EXTENDEDPRICESUM_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_orderkey_fd = open((A_ORDERKEY_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_lineitemposition_fd = open((A_LINEITEMPOSITION_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);

  auto size = a_orderkey[i][0] + 1;

  fallocate(a_orderdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_minshipdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_maxshipdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_extendedpricesum_fd, 0, 0, size * sizeof(uint32_t));
  fallocate(a_orderkey_fd, 0, 0, size * sizeof(uint32_t));
  fallocate(a_lineitemposition_fd, 0, 0, size * sizeof(uint32_t));

  auto a_orderdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_orderdate_fd, 0);
  auto a_minshipdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_minshipdate_fd, 0);
  auto a_maxshipdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_maxshipdate_fd, 0);
  auto a_extendedpricesum_mmap = (uint32_t *) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_extendedpricesum_fd, 0);
  auto a_orderkey_mmap = (uint32_t*) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_orderkey_fd, 0);
  auto a_lineitemposition_mmap = (uint32_t*) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_lineitemposition_fd, 0);

  memcpy(a_orderdate_mmap, a_orderdate[i], size * sizeof(uint16_t));
  memcpy(a_minshipdate_mmap, a_minshipdate[i], size * sizeof(uint16_t));
  memcpy(a_maxshipdate_mmap, a_maxshipdate[i], size * sizeof(uint16_t));
  memcpy(a_extendedpricesum_mmap, a_extendedpricesum[i], size * sizeof(uint32_t));
  memcpy(a_orderkey_mmap, a_orderkey[i], size * sizeof(uint32_t));
  memcpy(a_lineitemposition_mmap, a_lineitemposition[i], size * sizeof(uint32_t));

  close(a_orderdate_fd);
  close(a_minshipdate_fd);
  close(a_maxshipdate_fd);
  close(a_extendedpricesum_fd);
  close(a_orderkey_fd);
  close(a_lineitemposition_fd);

  --pending;
}